

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O1

int __thiscall
glcts::GeometryShaderRenderingLinesCase::verify
          (GeometryShaderRenderingLinesCase *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,
          uchar *tbs,size_t tbslen)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  TestError *this_00;
  int iVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  int i_5;
  _func_int **pp_Var9;
  uint n_channel;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  uint single_rt_height;
  uint single_rt_width;
  Vector<float,_4> res;
  Vector<float,_4> res_1;
  float reference_rgba [4];
  uint rt_width;
  uint rt_height;
  Vector<float,_4> res_2;
  uint local_24c;
  float local_248 [8];
  size_t local_228;
  float local_21c;
  float afStack_218 [8];
  undefined8 local_1f8;
  GeometryShaderRenderingLinesCase *local_1f0;
  float fStack_1e4;
  float afStack_1e0 [4];
  float afStack_1d0 [4];
  int local_1c0 [2];
  undefined1 auStack_1b8 [8];
  undefined8 uStack_1b0;
  ios_base aiStack_140 [272];
  
  local_1c0[1] = 0;
  local_1c0[0] = 0;
  local_24c = 0;
  pp_Var9 = (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
            super_TestNode._vptr_TestNode;
  uVar7 = 1;
  local_228 = siglen;
  if (((uint)ctx & 0xfffffffd) == 1) {
    uVar3 = (*pp_Var9[5])(this,1);
    uVar7 = (ulong)uVar3;
    pp_Var9 = (this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
              super_TestNode._vptr_TestNode;
  }
  (*pp_Var9[0xd])(this,uVar7,local_1c0,local_1c0 + 1);
  (*(this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.super_TestNode.
    _vptr_TestNode[0xd])(this,1,&local_24c);
  uVar3 = local_1c0[0] * 4;
  iVar4 = *(int *)&(this->super_GeometryShaderRenderingCase).field_0x304;
  if (iVar4 == 0) {
    local_21c = (float)(local_24c - 1);
    local_1f8 = 1;
    local_248[0] = 0.0;
    local_248[1] = 1.0;
    local_248[2] = 0.0;
    local_248[3] = 0.0;
    afStack_218[4] = 1.0;
    afStack_218[5] = 0.0;
    afStack_218[6] = 0.0;
    afStack_218[7] = 0.0;
    iVar4 = 4;
    lVar5 = 0;
    while (lVar5 == 0) {
LAB_00d2cf7d:
      lVar5 = lVar5 + 1;
      iVar4 = iVar4 + 0x18;
      if (lVar5 == 8) {
        local_1f0 = this;
        iVar4 = (*(code *)&UNK_00d2cda5)();
        return iVar4;
      }
    }
    afStack_218[0] = 0.0;
    afStack_218[1] = 0.0;
    afStack_218[2] = 0.0;
    afStack_218[3] = 0.0;
    local_248[4] = 0.0;
    local_248[5] = 0.0;
    local_248[6] = 0.0;
    local_248[7] = 0.0;
    lVar8 = 0;
    do {
      afStack_218[lVar8] =
           ((local_248[lVar8] - afStack_218[lVar8 + 4]) * (float)(int)lVar5) / 7.0 +
           afStack_218[lVar8 + 4];
      local_248[lVar8 + 4] =
           (float)*(byte *)((ulong)uVar3 + (long)iVar4 + local_228 + lVar8) / 255.0;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    fVar13 = afStack_218[0];
    fVar15 = local_248[4] - afStack_218[0];
    fVar11 = -fVar15;
    if (-fVar15 <= fVar15) {
      fVar11 = fVar15;
    }
    if (fVar11 <= 0.00390625) {
      fVar15 = local_248[5] - afStack_218[1];
      fVar11 = -fVar15;
      if (-fVar15 <= fVar15) {
        fVar11 = fVar15;
      }
      if (fVar11 <= 0.00390625) {
        fVar15 = local_248[6] - afStack_218[2];
        fVar11 = -fVar15;
        if (-fVar15 <= fVar15) {
          fVar11 = fVar15;
        }
        if (fVar11 <= 0.00390625) {
          fVar15 = local_248[7] - afStack_218[3];
          fVar11 = -fVar15;
          if (-fVar15 <= fVar15) {
            fVar11 = fVar15;
          }
          if (fVar11 <= 0.00390625) goto LAB_00d2cf7d;
        }
      }
    }
    local_228 = CONCAT44(local_228._4_4_,local_248[4]);
    auStack_1b8 = (undefined1  [8])
                  ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                   super_TestNode.m_testCtx)->m_log;
    local_1f0 = this;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1b0,"Rendered data at (",0x12);
    std::ostream::operator<<((ostringstream *)&uStack_1b0,(int)lVar5 * 6 + 1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
    std::ostream::operator<<((ostringstream *)&uStack_1b0,1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,") ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,"equal (",7);
    std::ostream::_M_insert<double>((double)(float)local_228);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
    std::ostream::_M_insert<double>((double)local_248[5]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
    std::ostream::_M_insert<double>((double)local_248[6]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
    std::ostream::_M_insert<double>((double)local_248[7]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,") ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&uStack_1b0,
               "exceeds allowed epsilon when compared to reference data equal (",0x3f);
    std::ostream::_M_insert<double>((double)fVar13);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
    std::ostream::_M_insert<double>((double)afStack_218[1]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
    std::ostream::_M_insert<double>((double)afStack_218[2]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
    std::ostream::_M_insert<double>((double)afStack_218[3]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,").",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)auStack_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
    std::ios_base::~ios_base(aiStack_140);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Data comparison failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0xe4a);
  }
  else {
    if (iVar4 == 1) {
      iVar4 = 0;
      do {
        afStack_218[4] = 1.0;
        afStack_218[5] = 0.0;
        afStack_218[6] = 0.0;
        afStack_218[7] = 0.0;
        lVar5 = 0;
        do {
          afStack_218[lVar5] = 0.5;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        local_248[0] = 0.0;
        local_248[1] = 0.0;
        local_248[2] = 0.0;
        local_248[3] = 0.0;
        lVar5 = 0;
        do {
          local_248[lVar5] = afStack_218[lVar5 + 4] * afStack_218[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        afStack_1d0[0] = 0.0;
        afStack_1d0[1] = 1.0;
        afStack_1d0[2] = 0.0;
        afStack_1d0[3] = 0.0;
        lVar5 = 0;
        do {
          afStack_1e0[lVar5] = 0.5;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        local_248[4] = 0.0;
        local_248[5] = 0.0;
        local_248[6] = 0.0;
        local_248[7] = 0.0;
        lVar5 = 0;
        do {
          local_248[lVar5 + 4] = afStack_1d0[lVar5] * afStack_1e0[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        auStack_1b8 = (undefined1  [8])0x0;
        uStack_1b0 = (_func_int **)0x0;
        lVar5 = 0;
        do {
          *(float *)(auStack_1b8 + lVar5 * 4) = local_248[lVar5] + local_248[lVar5 + 4];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        uVar1 = auStack_1b8._0_4_;
        uVar2 = auStack_1b8._4_4_;
        fVar13 = uStack_1b0._4_4_;
        if (0 < (int)(local_24c - 6)) {
          iVar6 = 0;
          do {
            iVar10 = iVar6;
            if (local_24c == 6) {
              iVar10 = 0;
            }
            local_248[0] = 0.0;
            local_248[1] = 0.0;
            local_248[2] = 0.0;
            local_248[3] = 0.0;
            lVar5 = 0;
            do {
              local_248[lVar5] =
                   (float)*(byte *)((long)((iVar10 + 3) * 4) + local_228 + (ulong)uVar3 + lVar5) /
                   255.0;
              lVar5 = lVar5 + 1;
            } while (lVar5 != 4);
            fVar15 = local_248[0] - (float)auStack_1b8._0_4_;
            fVar11 = -fVar15;
            if (-fVar15 <= fVar15) {
              fVar11 = fVar15;
            }
            if (0.00390625 < fVar11) {
LAB_00d2caa0:
              local_228 = CONCAT44(local_228._4_4_,local_248[0]);
              local_1f8 = CONCAT44(local_1f8._4_4_,(float)uStack_1b0);
              auStack_1b8 = (undefined1  [8])
                            ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.
                             super_TestCase.super_TestNode.m_testCtx)->m_log;
              local_1f0 = this;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&uStack_1b0,"Rendered data at (",0x12);
              std::ostream::operator<<((ostringstream *)&uStack_1b0,iVar10 + 3);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
              std::ostream::operator<<((ostringstream *)&uStack_1b0,1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,") ",2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,"equal (",7)
              ;
              std::ostream::_M_insert<double>((double)(float)local_228);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
              std::ostream::_M_insert<double>((double)local_248[1]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
              std::ostream::_M_insert<double>((double)local_248[2]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
              std::ostream::_M_insert<double>((double)local_248[3]);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,") ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&uStack_1b0,
                         "exceeds allowed epsilon when compared to reference data equal (",0x3f);
              std::ostream::_M_insert<double>((double)(float)uVar1);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
              std::ostream::_M_insert<double>((double)(float)uVar2);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
              std::ostream::_M_insert<double>((double)(float)local_1f8);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
              std::ostream::_M_insert<double>((double)fVar13);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,").",2);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)auStack_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage)
              ;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
              std::ios_base::~ios_base(aiStack_140);
              this_00 = (TestError *)__cxa_allocate_exception(0x38);
              tcu::TestError::TestError
                        (this_00,"Data comparison failed",(char *)0x0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                         ,0xdc4);
              goto LAB_00d2cd0a;
            }
            fVar15 = local_248[1] - (float)auStack_1b8._4_4_;
            fVar11 = -fVar15;
            if (-fVar15 <= fVar15) {
              fVar11 = fVar15;
            }
            if (0.00390625 < fVar11) goto LAB_00d2caa0;
            fVar15 = local_248[2] - (float)uStack_1b0;
            fVar11 = -fVar15;
            if (-fVar15 <= fVar15) {
              fVar11 = fVar15;
            }
            if (0.00390625 < fVar11) goto LAB_00d2caa0;
            fVar15 = local_248[3] - uStack_1b0._4_4_;
            fVar11 = -fVar15;
            if (-fVar15 <= fVar15) {
              fVar11 = fVar15;
            }
            if (0.00390625 < fVar11) goto LAB_00d2caa0;
            iVar6 = iVar6 + 1;
          } while (iVar6 != local_24c - 6);
        }
        iVar4 = iVar4 + 1;
        if (iVar4 == 4) {
          return 0x1b95b60;
        }
      } while( true );
    }
    if (iVar4 == 2) {
      fVar11 = (float)((ulong)sig & 0xffffffff);
      iVar4 = 0;
      local_21c = 0.0;
      fVar15 = 1.0;
      fVar13 = fVar11;
      while( true ) {
        iVar10 = (int)(((local_21c + 1.0 + 0.5) / 3.0) * (float)local_24c);
        iVar6 = (int)(((fVar13 + fVar11 + fVar11 + 0.5) / 3.0) * 0.0);
        lVar5 = uVar3 * iVar6 + local_228;
        lVar8 = (long)(iVar10 * 4);
        fVar18 = (float)*(byte *)(lVar8 + lVar5) / 255.0;
        fVar17 = (float)*(byte *)(lVar8 + 1 + lVar5) / 255.0;
        fVar16 = (float)*(byte *)(lVar8 + 2 + lVar5) / 255.0;
        fVar14 = (float)*(byte *)(lVar8 + 3 + lVar5) / 255.0;
        fVar12 = fVar18 - fVar15;
        fVar13 = -fVar12;
        if (-fVar12 <= fVar12) {
          fVar13 = fVar12;
        }
        if (0.00390625 < fVar13) break;
        fVar12 = fVar17 - local_21c;
        fVar13 = -fVar12;
        if (-fVar12 <= fVar12) {
          fVar13 = fVar12;
        }
        if (0.00390625 < fVar13) break;
        fVar12 = fVar16 - 0.0;
        fVar13 = -fVar12;
        if (-fVar12 <= fVar12) {
          fVar13 = fVar12;
        }
        if (0.00390625 < fVar13) break;
        fVar12 = fVar14 - 0.0;
        fVar13 = -fVar12;
        if (-fVar12 <= fVar12) {
          fVar13 = fVar12;
        }
        if (0.00390625 < fVar13) break;
        iVar4 = iVar4 + 1;
        if (iVar4 == 4) {
          return 0x1b95b40;
        }
        local_21c = 1.0;
        fVar15 = 0.0;
        fVar13 = fVar11 + 1.0;
      }
      local_228 = CONCAT44(local_228._4_4_,fVar18);
      local_1f8 = CONCAT44(local_1f8._4_4_,fVar14);
      local_1f0 = (GeometryShaderRenderingLinesCase *)((ulong)local_1f0 & 0xffffffff00000000);
      fStack_1e4 = 0.0;
      auStack_1b8 = (undefined1  [8])
                    ((this->super_GeometryShaderRenderingCase).super_TestCaseBase.super_TestCase.
                     super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&uStack_1b0,"Rendered data at (",0x12);
      std::ostream::operator<<((ostringstream *)&uStack_1b0,iVar10);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
      std::ostream::operator<<((ostringstream *)&uStack_1b0,iVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,") ",2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,"equal (",7);
      std::ostream::_M_insert<double>((double)(float)local_228);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
      std::ostream::_M_insert<double>((double)fVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
      std::ostream::_M_insert<double>((double)fVar16);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
      std::ostream::_M_insert<double>((double)(float)local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,") ",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&uStack_1b0,
                 "exceeds allowed epsilon when compared to reference data equal (",0x3f);
      std::ostream::_M_insert<double>((double)fVar15);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
      std::ostream::_M_insert<double>((double)local_21c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
      std::ostream::_M_insert<double>((double)local_1f0._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,", ",2);
      std::ostream::_M_insert<double>((double)fStack_1e4);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0,").",2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)auStack_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
      std::ios_base::~ios_base(aiStack_140);
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Data comparison failed",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0xeb2);
    }
    else {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Unsupported shader output type used",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0xebb);
    }
  }
LAB_00d2cd0a:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GeometryShaderRenderingLinesCase::verify(_draw_call_type drawcall_type, unsigned int instance_id,
											  const unsigned char* data)
{
	const float  epsilon		  = 1.0f / 256.0f;
	unsigned int rt_height		  = 0;
	unsigned int rt_width		  = 0;
	unsigned int single_rt_height = 0;
	unsigned int single_rt_width  = 0;

	if (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED ||
		drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED)
	{
		getRenderTargetSize(getAmountOfDrawInstances(), &rt_width, &rt_height);
	}
	else
	{
		getRenderTargetSize(1, &rt_width, &rt_height);
	}

	getRenderTargetSize(1, &single_rt_width, &single_rt_height);

	/* Verification is output type-specific */
	const unsigned int row_width = rt_width * 4 /* components */;

	switch (m_output_type)
	{
	case SHADER_OUTPUT_TYPE_LINE_STRIP:
	{
		/* The test renders a rectangle outline with 3 line segments for each edge.
		 * The verification checks color of each edge's middle line segment.
		 *
		 * Corners are skipped to keep the implementation simple. */
		for (unsigned int n_edge = 0; n_edge < 4 /* edges */; ++n_edge)
		{
			/* Determine edge-specific properties:
			 *
			 * Edge 0 - top edge;
			 * Edge 1 - right edge;
			 * Edge 2 - bottom edge;
			 * Edge 3 - left edge.
			 *
			 **/
			int		  end_x = 0;
			int		  end_y = 0;
			tcu::Vec4 expected_rgba;
			int		  start_x = 0;
			int		  start_y = 0;

			switch (n_edge)
			{
			case 0:
			{
				/* Top edge */
				start_x = 3;								  /* skip the corner */
				start_y = 1 + instance_id * single_rt_height; /* middle segment */

				end_x = single_rt_width - 3; /* skip the corner */
				end_y = start_y;

				expected_rgba = tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f) * tcu::Vec4(0.5f) +
								tcu::Vec4(0.0f, 1.0f, 0.0f, 0.0f) * tcu::Vec4(0.5f);

				break;
			}

			case 1:
			{
				/* Right edge */
				start_x = single_rt_width - 2;				  /* middle segment */
				start_y = 3 + instance_id * single_rt_height; /* skip the corner */

				end_x = start_x;
				end_y = start_y + single_rt_height - 6; /* skip the corners */

				expected_rgba = tcu::Vec4(0.0f, 1.0f, 0.0f, 0.0f) * tcu::Vec4(0.5f) +
								tcu::Vec4(0.0f, 0.0f, 1.0f, 0.0f) * tcu::Vec4(0.5f);

				break;
			}

			case 2:
			{
				/* Bottom edge */
				start_x = 3;													 /* skip the corner */
				start_y = single_rt_height - 3 + instance_id * single_rt_height; /* middle segment */

				end_x = single_rt_width - 6; /* skip the corners */
				end_y = start_y;

				expected_rgba = tcu::Vec4(0.0f, 0.0f, 1.0f, 0.0f) * tcu::Vec4(0.5f) +
								tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f) * tcu::Vec4(0.5f);

				break;
			}

			case 3:
			{
				/* Left edge */
				start_x = 1;								  /* middle segment */
				start_y = 3 + instance_id * single_rt_height; /* skip the corner */

				end_x = start_x;
				end_y = start_y + single_rt_height - 6; /* skip the corners */

				expected_rgba = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f) * tcu::Vec4(0.5f) +
								tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f) * tcu::Vec4(0.5f);

				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized edge index");
			}
			} /* switch(n_edge) */

			/* Move over the edge and make sure the rendered pixels are valid */
			int dx		 = (end_x != start_x) ? 1 : 0;
			int dy		 = (end_y != start_y) ? 1 : 0;
			int n_pixels = (end_x - start_x) + (end_y - start_y);

			for (int n_pixel = 0; n_pixel < n_pixels; ++n_pixel)
			{
				int cur_x = start_x + n_pixel * dx;
				int cur_y = start_y + n_pixel * dy;

				/* Calculate expected and rendered pixel color */
				const unsigned char* read_data		  = data + cur_y * row_width + cur_x * 4 /* components */;
				float				 rendered_rgba[4] = { 0 };

				for (unsigned int n_channel = 0; n_channel < 4 /* RGBA */; ++n_channel)
				{
					rendered_rgba[n_channel] = float(read_data[n_channel]) / 255.0f;
				}

				/* Compare the data */
				if (de::abs(rendered_rgba[0] - expected_rgba[0]) > epsilon ||
					de::abs(rendered_rgba[1] - expected_rgba[1]) > epsilon ||
					de::abs(rendered_rgba[2] - expected_rgba[2]) > epsilon ||
					de::abs(rendered_rgba[3] - expected_rgba[3]) > epsilon)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data at (" << cur_x << ", " << cur_y
									   << ") "
									   << "equal (" << rendered_rgba[0] << ", " << rendered_rgba[1] << ", "
									   << rendered_rgba[2] << ", " << rendered_rgba[3] << ") "
									   << "exceeds allowed epsilon when compared to reference data equal ("
									   << expected_rgba[0] << ", " << expected_rgba[1] << ", " << expected_rgba[2]
									   << ", " << expected_rgba[3] << ")." << tcu::TestLog::EndMessage;

					TCU_FAIL("Data comparison failed");
				} /* if (data comparison failed) */
			}	 /* for (all points) */
		}		  /* for (all edges) */

		break;
	} /* case SHADER_OUTPUT_TYPE_LINE_STRIP: */

	case SHADER_OUTPUT_TYPE_POINTS:
	{
		/* Verify centers of the points generated by geometry shader */
		int dx = 0;
		int dy = 0;

		bool ignore_first_point = false;
		int  start_x			= 0;
		int  start_y			= 0;

		tcu::Vec4 end_color;
		tcu::Vec4 start_color;

		for (unsigned int n_edge = 0; n_edge < 4 /* edges */; ++n_edge)
		{
			/* Determine edge-specific properties:
			 *
			 * Edge 0 - top edge; NOTE: the test should skip point at (1px, 1px) as it is overwritten by
			 *          edge 3!
			 * Edge 1 - right edge;
			 * Edge 2 - bottom edge;
			 * Edge 3 - left edge.
			 *
			 **/
			switch (n_edge)
			{
			case 0:
			{
				dx				   = 6;
				dy				   = 0;
				ignore_first_point = true;
				start_x			   = 1;
				start_y			   = 1 + instance_id * single_rt_height;

				end_color   = tcu::Vec4(0.0f, 1.0f, 0.0f, 0.0f);
				start_color = tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f);

				break;
			}

			case 1:
			{
				dx				   = 0;
				dy				   = 6;
				ignore_first_point = false;
				start_x			   = single_rt_width - 1;
				start_y			   = 1 + instance_id * single_rt_height;

				end_color   = tcu::Vec4(0.0f, 0.0f, 1.0f, 0.0f);
				start_color = tcu::Vec4(0.0f, 1.0f, 0.0f, 0.0f);

				break;
			}

			case 2:
			{
				dx				   = -6;
				dy				   = 0;
				ignore_first_point = false;
				start_x			   = single_rt_width - 1;
				start_y			   = single_rt_height - 1 + instance_id * single_rt_height;

				end_color   = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);
				start_color = tcu::Vec4(0.0f, 0.0f, 1.0f, 0.0f);

				break;
			}

			case 3:
			{
				dx				   = 0;
				dy				   = -6;
				ignore_first_point = false;
				start_x			   = 1;
				start_y			   = single_rt_height - 1 + instance_id * single_rt_height;

				end_color   = tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f);
				start_color = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);

				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized edge index");
			}
			} /* switch(n_edge) */

			for (unsigned int n_point = 0; n_point < 8 /* points */; ++n_point)
			{
				int cur_x = start_x + n_point * dx;
				int cur_y = start_y + n_point * dy;

				/* Skip the iteration if we're dealing with a first point, for which
				 * the comparison should be skipped */
				if (ignore_first_point && n_point == 0)
				{
					continue;
				}

				/* Calculate expected and rendered pixel color */
				const unsigned char* read_data		   = data + cur_y * row_width + cur_x * 4 /* components */;
				float				 reference_rgba[4] = { 0 };
				float				 rendered_rgba[4]  = { 0 };

				for (unsigned int n_channel = 0; n_channel < 4 /* RGBA */; ++n_channel)
				{
					reference_rgba[n_channel] = start_color[n_channel] +
												(end_color[n_channel] - start_color[n_channel]) * float(n_point) / 7.0f;
					rendered_rgba[n_channel] = (float)(read_data[n_channel]) / 255.0f;
				}

				/* Compare the data */
				if (de::abs(rendered_rgba[0] - reference_rgba[0]) > epsilon ||
					de::abs(rendered_rgba[1] - reference_rgba[1]) > epsilon ||
					de::abs(rendered_rgba[2] - reference_rgba[2]) > epsilon ||
					de::abs(rendered_rgba[3] - reference_rgba[3]) > epsilon)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data at (" << cur_x << ", " << cur_y
									   << ") "
									   << "equal (" << rendered_rgba[0] << ", " << rendered_rgba[1] << ", "
									   << rendered_rgba[2] << ", " << rendered_rgba[3] << ") "
									   << "exceeds allowed epsilon when compared to reference data equal ("
									   << reference_rgba[0] << ", " << reference_rgba[1] << ", " << reference_rgba[2]
									   << ", " << reference_rgba[3] << ")." << tcu::TestLog::EndMessage;

					TCU_FAIL("Data comparison failed");
				} /* if (data comparison failed) */

			} /* for (all points) */
		}	 /* for (all edges) */

		/* Done */
		break;
	} /* case SHADER_OUTPUT_TYPE_POINTS: */

	case SHADER_OUTPUT_TYPE_TRIANGLE_STRIP:
	{
		/* The test renders four triangles - two vertices are taken from each edge and the third
		 * one is set at (0, 0, 0, 1) (screen-space). The rendering output is verified by
		 * sampling centroids off each triangle */
		for (unsigned int n_edge = 0; n_edge < 4 /* edges */; ++n_edge)
		{
			/* Determine edge-specific properties */
			tcu::Vec2 centroid;
			tcu::Vec4 reference_rgba;
			tcu::Vec2 v1;
			tcu::Vec2 v2;
			tcu::Vec2 v3 = tcu::Vec2(0.5f, 0.5f + float(instance_id));

			switch (n_edge)
			{
			case 0:
			{
				/* Top edge */
				v1 = tcu::Vec2(0.0f, float(instance_id) + 0.0f);
				v2 = tcu::Vec2(1.0f, float(instance_id) + 0.0f);

				reference_rgba = tcu::Vec4(1.0f, 0.0f, 0.0f, 0.0f);

				break;
			}

			case 1:
			{
				/* Right edge */
				v1 = tcu::Vec2(1.0f, float(instance_id) + 0.0f);
				v2 = tcu::Vec2(1.0f, float(instance_id) + 1.0f);

				reference_rgba = tcu::Vec4(0.0f, 1.0f, 0.0f, 0.0f);

				break;
			}

			case 2:
			{
				/* Bottom edge */
				v1 = tcu::Vec2(0.0f, float(instance_id) + 1.0f);
				v2 = tcu::Vec2(1.0f, float(instance_id) + 1.0f);

				reference_rgba = tcu::Vec4(0.0f, 0.0f, 1.0f, 0.0f);

				break;
			}

			case 3:
			{
				/* Left edge */
				v1 = tcu::Vec2(0.0f, float(instance_id) + 0.0f);
				v2 = tcu::Vec2(0.0f, float(instance_id) + 1.0f);

				reference_rgba = tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f);

				break;
			}

			default:
			{
				TCU_FAIL("Unrecognized edge index");
			}
			} /* switch (n_edge) */

			/* Calculate centroid of the triangle. */
			centroid[0] = (v1[0] + v2[0] + v3[0]) / 3.0f;
			centroid[1] = (v1[1] + v2[1] + v3[1]) / 3.0f;

			/* Retrieve the sample */
			int centroid_xy[2] = { int(centroid[0] * float(single_rt_width)),
								   int(centroid[1] * float(single_rt_height)) };
			const unsigned char* rendered_rgba_ubyte =
				data + centroid_xy[1] * row_width + centroid_xy[0] * 4 /* components */;
			const float rendered_rgba_float[] = {
				float(rendered_rgba_ubyte[0]) / 255.0f, float(rendered_rgba_ubyte[1]) / 255.0f,
				float(rendered_rgba_ubyte[2]) / 255.0f, float(rendered_rgba_ubyte[3]) / 255.0f,
			};

			/* Compare the reference and rendered pixels */
			if (de::abs(rendered_rgba_float[0] - reference_rgba[0]) > epsilon ||
				de::abs(rendered_rgba_float[1] - reference_rgba[1]) > epsilon ||
				de::abs(rendered_rgba_float[2] - reference_rgba[2]) > epsilon ||
				de::abs(rendered_rgba_float[3] - reference_rgba[3]) > epsilon)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Rendered data at (" << centroid_xy[0] << ", "
								   << centroid_xy[1] << ") "
								   << "equal (" << rendered_rgba_float[0] << ", " << rendered_rgba_float[1] << ", "
								   << rendered_rgba_float[2] << ", " << rendered_rgba_float[3] << ") "
								   << "exceeds allowed epsilon when compared to reference data equal ("
								   << reference_rgba[0] << ", " << reference_rgba[1] << ", " << reference_rgba[2]
								   << ", " << reference_rgba[3] << ")." << tcu::TestLog::EndMessage;

				TCU_FAIL("Data comparison failed");
			} /* if (data comparison failed) */
		}	 /* for (all edges) */

		break;
	}

	default:
	{
		TCU_FAIL("Unsupported shader output type used");
	}
	} /* switch (m_output_type) */
}